

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_utility.cpp
# Opt level: O0

void R_ClearPastViewer(AActor *actor)

{
  uint uVar1;
  InterpolationViewer *pIVar2;
  uint local_14;
  uint i;
  AActor *actor_local;
  
  TArray<DVector3a,_DVector3a>::Clear(&InterpolationPath);
  for (local_14 = 0; uVar1 = TArray<InterpolationViewer,_InterpolationViewer>::Size(&PastViewers),
      local_14 < uVar1; local_14 = local_14 + 1) {
    pIVar2 = TArray<InterpolationViewer,_InterpolationViewer>::operator[]
                       (&PastViewers,(ulong)local_14);
    if (pIVar2->ViewActor == actor) {
      uVar1 = TArray<InterpolationViewer,_InterpolationViewer>::Size(&PastViewers);
      if (local_14 == uVar1) {
        TArray<InterpolationViewer,_InterpolationViewer>::Delete(&PastViewers,local_14);
      }
      else {
        pIVar2 = TArray<InterpolationViewer,_InterpolationViewer>::operator[]
                           (&PastViewers,(ulong)local_14);
        TArray<InterpolationViewer,_InterpolationViewer>::Pop(&PastViewers,pIVar2);
      }
    }
  }
  return;
}

Assistant:

void R_ClearPastViewer (AActor *actor)
{
	InterpolationPath.Clear();
	for (unsigned int i = 0; i < PastViewers.Size(); ++i)
	{
		if (PastViewers[i].ViewActor == actor)
		{
			// Found it, so remove it.
			if (i == PastViewers.Size())
			{
				PastViewers.Delete (i);
			}
			else
			{
				PastViewers.Pop (PastViewers[i]);
			}
		}
	}
}